

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ulong uVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  uint64_t recursive;
  uint64_t m;
  uint64_t n;
  _Bind<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_110;
  _Bind<std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_f8;
  _Bind<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  local_e0;
  Graph g;
  
  std::operator<<((ostream *)&std::cout,"Enter n and m: ");
  piVar1 = std::istream::_M_extract<unsigned_long>(&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::operator<<((ostream *)&std::cout,"Wanna sum recursion? ");
  std::istream::_M_extract<unsigned_long>(&std::cin);
  Graph::Graph(&g,n,m);
  uVar2 = m * n;
  if (uVar2 < 0x3e9) {
    operator<<((ostream *)&std::cout,&g);
  }
  local_e0._M_f = (offset_in_Graph_to_subr)Graph::random_bridges_search;
  local_e0._8_8_ = 0;
  name._M_str = "Random";
  name._M_len = 6;
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&g,name,&local_e0,uVar2 < 0x3e9);
  local_f8._M_f = (offset_in_Graph_to_subr)Graph::random_two_bridges_search;
  local_f8._8_8_ = 0;
  name_00._M_str = "Random two-bridges";
  name_00._M_len = 0x12;
  estimate<std::_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&g,name_00,&local_f8,uVar2 < 0x3e9);
  local_110._M_f = (offset_in_Graph_to_subr)Graph::determined_bridges_search;
  local_110._8_8_ = 0;
  name_01._M_str = "Determenistic";
  name_01._M_len = 0xd;
  estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
            (&g,name_01,&local_110,uVar2 < 0x3e9);
  Graph::~Graph(&g);
  return 0;
}

Assistant:

int main() {
    std::uint64_t n, m, recursive;

    std::cout << "Enter n and m: ";
    std::cin >> n >> m;
    std::cout << "Wanna sum recursion? ";
    std::cin >> recursive;

    Graph g(n, m);

    bool show = (n * m <= 1000);
    if (show)
        std::cout << g;

    estimate(g, "Random",
             std::bind(&Graph::random_bridges_search, _1, recursive), show);
    estimate(g, "Random two-bridges",
             std::bind(&Graph::random_two_bridges_search, _1, recursive), show);
    estimate(g, "Determenistic",
             std::bind(&Graph::determined_bridges_search, _1, recursive), show);
}